

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O0

ConversionResult
llvm::ConvertUTF8toUTF16
          (UTF8 **sourceStart,UTF8 *sourceEnd,UTF16 **targetStart,UTF16 *targetEnd,
          ConversionFlags flags)

{
  Boolean BVar1;
  ushort uVar2;
  uint uVar3;
  UTF16 *pUVar4;
  int local_44;
  unsigned_short extraBytesToRead;
  UTF16 *pUStack_40;
  UTF32 ch;
  UTF16 *target;
  UTF8 *source;
  ConversionResult result;
  ConversionFlags flags_local;
  UTF16 *targetEnd_local;
  UTF16 **targetStart_local;
  UTF8 *sourceEnd_local;
  UTF8 **sourceStart_local;
  
  source._0_4_ = conversionOK;
  target = (UTF16 *)*sourceStart;
  pUStack_40 = *targetStart;
  do {
    if (sourceEnd <= target) {
LAB_01f9056b:
      *sourceStart = (UTF8 *)target;
      *targetStart = pUStack_40;
      return (ConversionResult)source;
    }
    local_44 = 0;
    uVar2 = (ushort)(char)trailingBytesForUTF8[(byte)*target];
    if ((long)sourceEnd - (long)target <= (long)(ulong)uVar2) {
      source._0_4_ = sourceExhausted;
      goto LAB_01f9056b;
    }
    BVar1 = isLegalUTF8((UTF8 *)target,uVar2 + 1);
    if (BVar1 == '\0') {
      source._0_4_ = sourceIllegal;
      goto LAB_01f9056b;
    }
    switch(uVar2) {
    case 5:
      local_44 = (uint)(byte)*target << 6;
      target = (UTF16 *)((long)target + 1);
    case 4:
      local_44 = ((uint)(byte)*target + local_44) * 0x40;
      target = (UTF16 *)((long)target + 1);
    case 3:
      local_44 = ((uint)(byte)*target + local_44) * 0x40;
      target = (UTF16 *)((long)target + 1);
    case 2:
      local_44 = ((uint)(byte)*target + local_44) * 0x40;
      target = (UTF16 *)((long)target + 1);
    case 1:
      local_44 = ((uint)(byte)*target + local_44) * 0x40;
      target = (UTF16 *)((long)target + 1);
    case 0:
      local_44 = (uint)(byte)*target + local_44;
      target = (UTF16 *)((long)target + 1);
    }
    uVar3 = local_44 - *(int *)(offsetsFromUTF8 + (ulong)uVar2 * 4);
    if (targetEnd <= pUStack_40) {
      target = (UTF16 *)((long)target - (long)(int)(uVar2 + 1));
      source._0_4_ = targetExhausted;
      goto LAB_01f9056b;
    }
    if (uVar3 < 0x10000) {
      if ((uVar3 < 0xd800) || (0xdfff < uVar3)) {
        *pUStack_40 = (UTF16)uVar3;
      }
      else {
        if (flags == strictConversion) {
          target = (UTF16 *)((long)target - (long)(int)(uVar2 + 1));
          source._0_4_ = sourceIllegal;
          goto LAB_01f9056b;
        }
        *pUStack_40 = 0xfffd;
      }
      pUStack_40 = pUStack_40 + 1;
    }
    else if (uVar3 < 0x110000) {
      if (targetEnd <= pUStack_40 + 1) {
        target = (UTF16 *)((long)target - (long)(int)(uVar2 + 1));
        source._0_4_ = targetExhausted;
        goto LAB_01f9056b;
      }
      pUVar4 = pUStack_40 + 1;
      *pUStack_40 = (short)(uVar3 - 0x10000 >> 10) + 0xd800;
      pUStack_40 = pUStack_40 + 2;
      *pUVar4 = ((ushort)(uVar3 - 0x10000) & 0x3ff) + 0xdc00;
    }
    else {
      if (flags == strictConversion) {
        source._0_4_ = sourceIllegal;
        target = (UTF16 *)((long)target - (long)(int)(uVar2 + 1));
        goto LAB_01f9056b;
      }
      *pUStack_40 = 0xfffd;
      pUStack_40 = pUStack_40 + 1;
    }
  } while( true );
}

Assistant:

ConversionResult ConvertUTF8toUTF16 (
        const UTF8** sourceStart, const UTF8* sourceEnd,
        UTF16** targetStart, UTF16* targetEnd, ConversionFlags flags) {
    ConversionResult result = conversionOK;
    const UTF8* source = *sourceStart;
    UTF16* target = *targetStart;
    while (source < sourceEnd) {
        UTF32 ch = 0;
        unsigned short extraBytesToRead = trailingBytesForUTF8[*source];
        if (extraBytesToRead >= sourceEnd - source) {
            result = sourceExhausted; break;
        }
        /* Do this check whether lenient or strict */
        if (!isLegalUTF8(source, extraBytesToRead+1)) {
            result = sourceIllegal;
            break;
        }
        /*
         * The cases all fall through. See "Note A" below.
         */
        switch (extraBytesToRead) {
            case 5: ch += *source++; ch <<= 6; /* remember, illegal UTF-8 */
            case 4: ch += *source++; ch <<= 6; /* remember, illegal UTF-8 */
            case 3: ch += *source++; ch <<= 6;
            case 2: ch += *source++; ch <<= 6;
            case 1: ch += *source++; ch <<= 6;
            case 0: ch += *source++;
        }
        ch -= offsetsFromUTF8[extraBytesToRead];

        if (target >= targetEnd) {
            source -= (extraBytesToRead+1); /* Back up source pointer! */
            result = targetExhausted; break;
        }
        if (ch <= UNI_MAX_BMP) { /* Target is a character <= 0xFFFF */
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END) {
                if (flags == strictConversion) {
                    source -= (extraBytesToRead+1); /* return to the illegal value itself */
                    result = sourceIllegal;
                    break;
                } else {
                    *target++ = UNI_REPLACEMENT_CHAR;
                }
            } else {
                *target++ = (UTF16)ch; /* normal case */
            }
        } else if (ch > UNI_MAX_UTF16) {
            if (flags == strictConversion) {
                result = sourceIllegal;
                source -= (extraBytesToRead+1); /* return to the start */
                break; /* Bail out; shouldn't continue */
            } else {
                *target++ = UNI_REPLACEMENT_CHAR;
            }
        } else {
            /* target is a character in range 0xFFFF - 0x10FFFF. */
            if (target + 1 >= targetEnd) {
                source -= (extraBytesToRead+1); /* Back up source pointer! */
                result = targetExhausted; break;
            }
            ch -= halfBase;
            *target++ = (UTF16)((ch >> halfShift) + UNI_SUR_HIGH_START);
            *target++ = (UTF16)((ch & halfMask) + UNI_SUR_LOW_START);
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}